

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_descriptor.cpp
# Opt level: O0

void __thiscall
Descriptor_Parse_Taproot_pubkey_Test::TestBody(Descriptor_Parse_Taproot_pubkey_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  reference pvVar4;
  char *in_R9;
  AssertHelper local_20e8;
  Message local_20e0;
  string local_20d8;
  undefined1 local_20b8 [8];
  AssertionResult gtest_ar_16;
  Message local_20a0;
  string local_2098;
  undefined1 local_2078 [8];
  AssertionResult gtest_ar_15;
  Message local_2060;
  undefined1 local_2058 [8];
  AssertionResult gtest_ar_14;
  Message local_2040;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_2038;
  SchnorrPubkey local_2020;
  AssertHelper local_2008;
  Message local_2000;
  Address local_1ff8;
  string local_1e78;
  undefined1 local_1e58 [8];
  AssertionResult gtest_ar_13;
  Message local_1e40;
  HashType local_1e38 [2];
  undefined1 local_1e30 [8];
  AssertionResult gtest_ar_12;
  Message local_1e18;
  AddressType local_1e10 [2];
  undefined1 local_1e08 [8];
  AssertionResult gtest_ar_11;
  Message local_1df0;
  string local_1de8;
  AssertHelper local_1dc8;
  Message local_1dc0;
  Script local_1db8;
  string local_1d80;
  AssertHelper local_1d60;
  Message local_1d58;
  bool local_1d49;
  undefined1 local_1d48 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_1d18;
  Message local_1d10;
  bool local_1d01;
  undefined1 local_1d00 [8];
  AssertionResult gtest_ar__11;
  AssertHelper local_1cd0;
  Message local_1cc8;
  bool local_1cb9;
  undefined1 local_1cb8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_1c88;
  Message local_1c80;
  bool local_1c71;
  undefined1 local_1c70 [8];
  AssertionResult gtest_ar__9;
  Message local_1c58;
  uint32_t local_1c50 [2];
  undefined1 local_1c48 [8];
  AssertionResult gtest_ar_10;
  AssertHelper local_1c18;
  Message local_1c10;
  bool local_1c01;
  undefined1 local_1c00 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_1bd0;
  Message local_1bc8;
  bool local_1bb9;
  undefined1 local_1bb8 [8];
  AssertionResult gtest_ar__7;
  Message local_1ba0;
  DescriptorNode local_1b98;
  AssertHelper local_1a28;
  Message local_1a20;
  DescriptorScriptReference local_1a18;
  AssertionResult gtest_ar_9;
  CfdException *except_2;
  AssertionResult gtest_ar_8;
  CfdException *except_1;
  AssertHelper local_14d0;
  Message local_14c8;
  bool local_14b9;
  undefined1 local_14b8 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_1338;
  Message local_1330;
  string local_1328;
  undefined1 local_1308 [8];
  AssertionResult gtest_ar_7;
  Message local_12f0;
  string local_12e8;
  undefined1 local_12c8 [8];
  AssertionResult gtest_ar_6;
  Message local_12b0;
  undefined1 local_12a8 [8];
  AssertionResult gtest_ar_5;
  Message local_1290;
  vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
  local_1288;
  SchnorrPubkey local_1270;
  AssertHelper local_1258;
  Message local_1250;
  Address local_1248;
  string local_10c8;
  undefined1 local_10a8 [8];
  AssertionResult gtest_ar_4;
  Message local_1090;
  HashType local_1088 [2];
  undefined1 local_1080 [8];
  AssertionResult gtest_ar_3;
  Message local_1068;
  AddressType local_1060 [2];
  undefined1 local_1058 [8];
  AssertionResult gtest_ar_2;
  Message local_1040;
  string local_1038;
  AssertHelper local_1018;
  Message local_1010;
  Script local_1008;
  string local_fd0;
  AssertHelper local_fb0;
  Message local_fa8;
  bool local_f99;
  undefined1 local_f98 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_f68;
  Message local_f60;
  bool local_f51;
  undefined1 local_f50 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_f20;
  Message local_f18;
  bool local_f09;
  undefined1 local_f08 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_ed8;
  Message local_ed0;
  bool local_ec1;
  undefined1 local_ec0 [8];
  AssertionResult gtest_ar__2;
  Message local_ea8;
  uint32_t local_ea0 [2];
  undefined1 local_e98 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_e68;
  Message local_e60;
  bool local_e51;
  undefined1 local_e50 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_e20;
  Message local_e18;
  bool local_e09;
  undefined1 local_e08 [8];
  AssertionResult gtest_ar_;
  Message local_df0;
  DescriptorNode local_de8;
  AssertHelper local_c78;
  Message local_c70 [2];
  DescriptorScriptReference local_c60;
  AssertionResult gtest_ar;
  CfdException *except;
  undefined1 local_760 [8];
  DescriptorNode node;
  undefined1 local_5e8 [4];
  NetType nettype;
  SchnorrPubkey pubkey;
  DescriptorScriptReference script_ref;
  string local_260 [8];
  string desc_str;
  Script locking_script;
  Descriptor desc;
  undefined1 local_90 [8];
  string descriptor2;
  undefined1 local_68 [8];
  string descriptor1;
  allocator local_31;
  string local_30 [8];
  string pubkey_hex;
  Descriptor_Parse_Taproot_pubkey_Test *this_local;
  
  pubkey_hex.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,"ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_68,
             "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a)",
             (allocator *)(descriptor2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(descriptor2.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_90,
             "tr(03ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a)",
             (allocator *)&desc.root_node_.field_0x16f);
  std::allocator<char>::~allocator((allocator<char> *)&desc.root_node_.field_0x16f);
  cfd::core::Descriptor::Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script((Script *)((long)&desc_str.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_260,"",
             (allocator *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&script_ref.addr_prefixes_.
                     super__Vector_base<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::DescriptorScriptReference::DescriptorScriptReference
            ((DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::SchnorrPubkey((SchnorrPubkey *)local_5e8);
  node._364_4_ = 2;
  cfd::core::DescriptorNode::DescriptorNode((DescriptorNode *)local_760);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&except,(string *)local_68,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kMainnet);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReference
                (&local_c60,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      cfd::core::DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_c60);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_c60);
    }
  }
  else {
    testing::Message::Message(local_c70);
    testing::internal::AssertHelper::AssertHelper
              (&local_c78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x409,
               "Expected: script_ref = desc.GetReference() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_c78,local_c70);
    testing::internal::AssertHelper::~AssertHelper(&local_c78);
    testing::Message::~Message(local_c70);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetNode
                (&local_de8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::DescriptorNode::operator=((DescriptorNode *)local_760,&local_de8);
      cfd::core::DescriptorNode::~DescriptorNode(&local_de8);
    }
  }
  else {
    testing::Message::Message(&local_df0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x40a,
               "Expected: node = desc.GetNode() doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_df0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_df0);
  }
  local_e09 = cfd::core::DescriptorScriptReference::HasKey
                        ((DescriptorScriptReference *)
                         &pubkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e08,&local_e09,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e08);
  if (!bVar1) {
    testing::Message::Message(&local_e18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_e08,(AssertionResult *)0x71f331,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x40b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e20,&local_e18);
    testing::internal::AssertHelper::~AssertHelper(&local_e20);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_e18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e08);
  local_e51 = cfd::core::DescriptorScriptReference::HasAddress
                        ((DescriptorScriptReference *)
                         &pubkey.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_e50,&local_e51,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e50);
  if (!bVar1) {
    testing::Message::Message(&local_e60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_1.message_,(internal *)local_e50,
               (AssertionResult *)"script_ref.HasAddress()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_e68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x40c,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e68,&local_e60);
    testing::internal::AssertHelper::~AssertHelper(&local_e68);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_e60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e50);
  local_ea0[1] = 1;
  local_ea0[0] = cfd::core::DescriptorScriptReference::GetKeyNum
                           ((DescriptorScriptReference *)
                            &pubkey.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_e98,"1","script_ref.GetKeyNum()",(int *)(local_ea0 + 1),
             local_ea0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e98);
  if (!bVar1) {
    testing::Message::Message(&local_ea8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x40d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_ea8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_ea8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e98);
  bVar1 = cfd::core::DescriptorScriptReference::HasChild
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_ec1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_ec0,&local_ec1,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_ec0);
  if (!bVar1) {
    testing::Message::Message(&local_ed0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__3.message_,(internal *)local_ec0,
               (AssertionResult *)"script_ref.HasChild()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ed8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x40e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_ed8,&local_ed0);
    testing::internal::AssertHelper::~AssertHelper(&local_ed8);
    std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
    testing::Message::~Message(&local_ed0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_ec0);
  bVar1 = cfd::core::DescriptorScriptReference::HasReqNum
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_f09 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f08,&local_f09,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f08);
  if (!bVar1) {
    testing::Message::Message(&local_f18);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__4.message_,(internal *)local_f08,
               (AssertionResult *)"script_ref.HasReqNum()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x40f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f20,&local_f18);
    testing::internal::AssertHelper::~AssertHelper(&local_f20);
    std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
    testing::Message::~Message(&local_f18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f08);
  bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_f51 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f50,&local_f51,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f50);
  if (!bVar1) {
    testing::Message::Message(&local_f60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__5.message_,(internal *)local_f50,
               (AssertionResult *)"script_ref.HasRedeemScript()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x410,pcVar2);
    testing::internal::AssertHelper::operator=(&local_f68,&local_f60);
    testing::internal::AssertHelper::~AssertHelper(&local_f68);
    std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
    testing::Message::~Message(&local_f60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f50);
  bVar1 = cfd::core::DescriptorScriptReference::HasScriptTree
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_f99 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_f98,&local_f99,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f98);
  if (!bVar1) {
    testing::Message::Message(&local_fa8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_fd0,(internal *)local_f98,(AssertionResult *)"script_ref.HasScriptTree()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fb0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x411,pcVar2);
    testing::internal::AssertHelper::operator=(&local_fb0,&local_fa8);
    testing::internal::AssertHelper::~AssertHelper(&local_fb0);
    std::__cxx11::string::~string((string *)&local_fd0);
    testing::Message::~Message(&local_fa8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f98);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_1008,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_1008);
      cfd::core::Script::~Script(&local_1008);
    }
  }
  else {
    testing::Message::Message(&local_1010);
    testing::internal::AssertHelper::AssertHelper
              (&local_1018,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x412,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1018,&local_1010);
    testing::internal::AssertHelper::~AssertHelper(&local_1018);
    testing::Message::~Message(&local_1010);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_1038,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_260,(string *)&local_1038);
      std::__cxx11::string::~string((string *)&local_1038);
    }
  }
  else {
    testing::Message::Message(&local_1040);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x413,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1040);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1040);
  }
  local_1060[1] = 7;
  local_1060[0] =
       cfd::core::DescriptorScriptReference::GetAddressType
                 ((DescriptorScriptReference *)
                  &pubkey.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_1058,"AddressType::kTaprootAddress",
             "script_ref.GetAddressType()",local_1060 + 1,local_1060);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1058);
  if (!bVar1) {
    testing::Message::Message(&local_1068);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1058);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x414,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1068);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_1068);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1058);
  local_1088[1] = 6;
  local_1088[0] =
       cfd::core::DescriptorScriptReference::GetHashType
                 ((DescriptorScriptReference *)
                  &pubkey.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::HashType,cfd::core::HashType>
            ((EqHelper<false> *)local_1080,"HashType::kTaproot","script_ref.GetHashType()",
             local_1088 + 1,local_1088);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1080);
  if (!bVar1) {
    testing::Message::Message(&local_1090);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1080);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x415,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1090);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_1090);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1080);
  cfd::core::DescriptorScriptReference::GenerateAddress
            (&local_1248,
             (DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,node._364_4_);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_10c8,&local_1248);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_10a8,"script_ref.GenerateAddress(nettype).GetAddress().c_str()",
             "\"bcrt1pvv8jm84ye0xr7p9h8l2k58rm287nryk73cnw0nvfxyjfqqpn60gssz7u5f\"",pcVar2,
             "bcrt1pvv8jm84ye0xr7p9h8l2k58rm287nryk73cnw0nvfxyjfqqpn60gssz7u5f");
  std::__cxx11::string::~string((string *)&local_10c8);
  cfd::core::Address::~Address(&local_1248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10a8);
  if (!bVar1) {
    testing::Message::Message(&local_1250);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_10a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1258,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x417,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1258,&local_1250);
    testing::internal::AssertHelper::~AssertHelper(&local_1258);
    testing::Message::~Message(&local_1250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_10a8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetKeyList
                (&local_1288,
                 (DescriptorScriptReference *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pvVar4 = std::
               vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
               ::operator[](&local_1288,0);
      cfd::core::DescriptorKeyReference::GetSchnorrPubkey(&local_1270,pvVar4);
      cfd::core::SchnorrPubkey::operator=((SchnorrPubkey *)local_5e8,&local_1270);
      cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_1270);
      std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector(&local_1288);
    }
  }
  else {
    testing::Message::Message(&local_1290);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x418,
               "Expected: pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1290);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_12a8,"desc_str.c_str()","descriptor1.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12a8);
  if (!bVar1) {
    testing::Message::Message(&local_12b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_12a8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x419,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_12b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_12b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12a8);
  cfd::core::Script::ToString_abi_cxx11_(&local_12e8,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_12c8,"locking_script.ToString().c_str()",
             "\"1 630f2d9ea4cbcc3f04b73fd56a1c7b51fd3192de8e26e7cd893124900033d3d1\"",pcVar2,
             "1 630f2d9ea4cbcc3f04b73fd56a1c7b51fd3192de8e26e7cd893124900033d3d1");
  std::__cxx11::string::~string((string *)&local_12e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_12c8);
  if (!bVar1) {
    testing::Message::Message(&local_12f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_12c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x41b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_12f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_12f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_12c8);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1328,(SchnorrPubkey *)local_5e8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1308,"pubkey.GetHex().c_str()","pubkey_hex.c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_1328);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1308);
  if (!bVar1) {
    testing::Message::Message(&local_1330);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1308);
    testing::internal::AssertHelper::AssertHelper
              (&local_1338,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x41d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1338,&local_1330);
    testing::internal::AssertHelper::~AssertHelper(&local_1338);
    testing::Message::~Message(&local_1330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1308);
  cfd::core::Descriptor::Parse
            ((Descriptor *)&gtest_ar__6.message_,(string *)local_90,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,kMainnet);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&gtest_ar__6.message_
            );
  cfd::core::Descriptor::~Descriptor((Descriptor *)&gtest_ar__6.message_);
  local_14b9 = false;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_14b8,&local_14b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_14b8);
  if (!bVar1) {
    testing::Message::Message(&local_14c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&except_1,(internal *)local_14b8,(AssertionResult *)0x6e96c0,"false","true"
               ,in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_14d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x421,pcVar2);
    testing::internal::AssertHelper::operator=(&local_14d0,&local_14c8);
    testing::internal::AssertHelper::~AssertHelper(&local_14d0);
    std::__cxx11::string::~string((string *)&except_1);
    testing::Message::~Message(&local_14c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_14b8);
  cfd::core::Descriptor::ParseElements((Descriptor *)&except_2,(string *)local_68);
  cfd::core::Descriptor::operator=
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Descriptor *)&except_2);
  cfd::core::Descriptor::~Descriptor((Descriptor *)&except_2);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetReference
                (&local_1a18,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0);
      cfd::core::DescriptorScriptReference::operator=
                ((DescriptorScriptReference *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_1a18);
      cfd::core::DescriptorScriptReference::~DescriptorScriptReference(&local_1a18);
    }
  }
  else {
    testing::Message::Message(&local_1a20);
    testing::internal::AssertHelper::AssertHelper
              (&local_1a28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x42f,
               "Expected: script_ref = desc.GetReference() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1a28,&local_1a20);
    testing::internal::AssertHelper::~AssertHelper(&local_1a28);
    testing::Message::~Message(&local_1a20);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetNode
                (&local_1b98,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::DescriptorNode::operator=((DescriptorNode *)local_760,&local_1b98);
      cfd::core::DescriptorNode::~DescriptorNode(&local_1b98);
    }
  }
  else {
    testing::Message::Message(&local_1ba0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x430,
               "Expected: node = desc.GetNode() doesn\'t throw an exception.\n  Actual: it throws.")
    ;
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__7.message_,&local_1ba0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__7.message_);
    testing::Message::~Message(&local_1ba0);
  }
  local_1bb9 = cfd::core::DescriptorScriptReference::HasKey
                         ((DescriptorScriptReference *)
                          &pubkey.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1bb8,&local_1bb9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1bb8);
  if (!bVar1) {
    testing::Message::Message(&local_1bc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__8.message_,(internal *)local_1bb8,(AssertionResult *)0x71f331,
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1bd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x431,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1bd0,&local_1bc8);
    testing::internal::AssertHelper::~AssertHelper(&local_1bd0);
    std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
    testing::Message::~Message(&local_1bc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1bb8);
  local_1c01 = cfd::core::DescriptorScriptReference::HasAddress
                         ((DescriptorScriptReference *)
                          &pubkey.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c00,&local_1c01,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c00);
  if (!bVar1) {
    testing::Message::Message(&local_1c10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_10.message_,(internal *)local_1c00,
               (AssertionResult *)"script_ref.HasAddress()","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x432,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c18,&local_1c10);
    testing::internal::AssertHelper::~AssertHelper(&local_1c18);
    std::__cxx11::string::~string((string *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_1c10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c00);
  local_1c50[1] = 1;
  local_1c50[0] =
       cfd::core::DescriptorScriptReference::GetKeyNum
                 ((DescriptorScriptReference *)
                  &pubkey.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<int,unsigned_int>
            ((EqHelper<false> *)local_1c48,"1","script_ref.GetKeyNum()",(int *)(local_1c50 + 1),
             local_1c50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c48);
  if (!bVar1) {
    testing::Message::Message(&local_1c58);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c48);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x433,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__9.message_,&local_1c58);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__9.message_);
    testing::Message::~Message(&local_1c58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c48);
  bVar1 = cfd::core::DescriptorScriptReference::HasChild
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_1c71 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1c70,&local_1c71,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c70);
  if (!bVar1) {
    testing::Message::Message(&local_1c80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__10.message_,(internal *)local_1c70,
               (AssertionResult *)"script_ref.HasChild()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1c88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x434,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1c88,&local_1c80);
    testing::internal::AssertHelper::~AssertHelper(&local_1c88);
    std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
    testing::Message::~Message(&local_1c80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c70);
  bVar1 = cfd::core::DescriptorScriptReference::HasReqNum
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_1cb9 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1cb8,&local_1cb9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1cb8);
  if (!bVar1) {
    testing::Message::Message(&local_1cc8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__11.message_,(internal *)local_1cb8,
               (AssertionResult *)"script_ref.HasReqNum()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1cd0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x435,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1cd0,&local_1cc8);
    testing::internal::AssertHelper::~AssertHelper(&local_1cd0);
    std::__cxx11::string::~string((string *)&gtest_ar__11.message_);
    testing::Message::~Message(&local_1cc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1cb8);
  bVar1 = cfd::core::DescriptorScriptReference::HasRedeemScript
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_1d01 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d00,&local_1d01,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d00);
  if (!bVar1) {
    testing::Message::Message(&local_1d10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__12.message_,(internal *)local_1d00,
               (AssertionResult *)"script_ref.HasRedeemScript()","true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x436,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d18,&local_1d10);
    testing::internal::AssertHelper::~AssertHelper(&local_1d18);
    std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
    testing::Message::~Message(&local_1d10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d00);
  bVar1 = cfd::core::DescriptorScriptReference::HasScriptTree
                    ((DescriptorScriptReference *)
                     &pubkey.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  local_1d49 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1d48,&local_1d49,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d48);
  if (!bVar1) {
    testing::Message::Message(&local_1d58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d80,(internal *)local_1d48,(AssertionResult *)"script_ref.HasScriptTree()",
               "true","false",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x437,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1d60,&local_1d58);
    testing::internal::AssertHelper::~AssertHelper(&local_1d60);
    std::__cxx11::string::~string((string *)&local_1d80);
    testing::Message::~Message(&local_1d58);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d48);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::GetLockingScript
                (&local_1db8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cfd::core::Script::operator=((Script *)((long)&desc_str.field_2 + 8),&local_1db8);
      cfd::core::Script::~Script(&local_1db8);
    }
  }
  else {
    testing::Message::Message(&local_1dc0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1dc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x438,
               "Expected: locking_script = desc.GetLockingScript() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1dc8,&local_1dc0);
    testing::internal::AssertHelper::~AssertHelper(&local_1dc8);
    testing::Message::~Message(&local_1dc0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Descriptor::ToString_abi_cxx11_
                (&local_1de8,
                 (Descriptor *)
                 &locking_script.script_stack_.
                  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
      std::__cxx11::string::operator=(local_260,(string *)&local_1de8);
      std::__cxx11::string::~string((string *)&local_1de8);
    }
  }
  else {
    testing::Message::Message(&local_1df0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_11.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x439,
               "Expected: desc_str = desc.ToString(false) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_11.message_,&local_1df0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
    testing::Message::~Message(&local_1df0);
  }
  local_1e10[1] = 7;
  local_1e10[0] =
       cfd::core::DescriptorScriptReference::GetAddressType
                 ((DescriptorScriptReference *)
                  &pubkey.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::AddressType,cfd::core::AddressType>
            ((EqHelper<false> *)local_1e08,"AddressType::kTaprootAddress",
             "script_ref.GetAddressType()",local_1e10 + 1,local_1e10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e08);
  if (!bVar1) {
    testing::Message::Message(&local_1e18);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e08);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_12.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_12.message_,&local_1e18);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_12.message_);
    testing::Message::~Message(&local_1e18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e08);
  local_1e38[1] = 6;
  local_1e38[0] =
       cfd::core::DescriptorScriptReference::GetHashType
                 ((DescriptorScriptReference *)
                  &pubkey.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<cfd::core::HashType,cfd::core::HashType>
            ((EqHelper<false> *)local_1e30,"HashType::kTaproot","script_ref.GetHashType()",
             local_1e38 + 1,local_1e38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e30);
  if (!bVar1) {
    testing::Message::Message(&local_1e40);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_13.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_13.message_,&local_1e40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_13.message_);
    testing::Message::~Message(&local_1e40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e30);
  cfd::core::DescriptorScriptReference::GenerateAddress
            (&local_1ff8,
             (DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,kElementsRegtest);
  cfd::core::Address::GetAddress_abi_cxx11_(&local_1e78,&local_1ff8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1e58,
             "script_ref.GenerateAddress(NetType::kElementsRegtest).GetAddress().c_str()",
             "\"ert1p5l62rfvlte3axg3aeu6p0zwnqr60adqc427jkz70sadzxtjdy7tshjlu6s\"",pcVar2,
             "ert1p5l62rfvlte3axg3aeu6p0zwnqr60adqc427jkz70sadzxtjdy7tshjlu6s");
  std::__cxx11::string::~string((string *)&local_1e78);
  cfd::core::Address::~Address(&local_1ff8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e58);
  if (!bVar1) {
    testing::Message::Message(&local_2000);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e58);
    testing::internal::AssertHelper::AssertHelper
              (&local_2008,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2008,&local_2000);
    testing::internal::AssertHelper::~AssertHelper(&local_2008);
    testing::Message::~Message(&local_2000);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e58);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::DescriptorScriptReference::GetKeyList
                (&local_2038,
                 (DescriptorScriptReference *)
                 &pubkey.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pvVar4 = std::
               vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
               ::operator[](&local_2038,0);
      cfd::core::DescriptorKeyReference::GetSchnorrPubkey(&local_2020,pvVar4);
      cfd::core::SchnorrPubkey::operator=((SchnorrPubkey *)local_5e8,&local_2020);
      cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_2020);
      std::
      vector<cfd::core::DescriptorKeyReference,_std::allocator<cfd::core::DescriptorKeyReference>_>
      ::~vector(&local_2038);
    }
  }
  else {
    testing::Message::Message(&local_2040);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_14.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x43f,
               "Expected: pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey() doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_14.message_,&local_2040);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_14.message_);
    testing::Message::~Message(&local_2040);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2058,"desc_str.c_str()","descriptor1.c_str()",pcVar2,pcVar3);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2058);
  if (!bVar1) {
    testing::Message::Message(&local_2060);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2058);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_15.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x440,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_15.message_,&local_2060);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_15.message_);
    testing::Message::~Message(&local_2060);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2058);
  cfd::core::Script::ToString_abi_cxx11_(&local_2098,(Script *)((long)&desc_str.field_2 + 8));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2078,"locking_script.ToString().c_str()",
             "\"1 a7f4a1a59f5e63d3223dcf341789d300f4feb418aabd2b0bcf875a232e4d2797\"",pcVar2,
             "1 a7f4a1a59f5e63d3223dcf341789d300f4feb418aabd2b0bcf875a232e4d2797");
  std::__cxx11::string::~string((string *)&local_2098);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2078);
  if (!bVar1) {
    testing::Message::Message(&local_20a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2078);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x442,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_16.message_,&local_20a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_16.message_);
    testing::Message::~Message(&local_20a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2078);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_20d8,(SchnorrPubkey *)local_5e8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_20b8,"pubkey.GetHex().c_str()","pubkey_hex.c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_20d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20b8);
  if (!bVar1) {
    testing::Message::Message(&local_20e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_20e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_descriptor.cpp"
               ,0x444,pcVar2);
    testing::internal::AssertHelper::operator=(&local_20e8,&local_20e0);
    testing::internal::AssertHelper::~AssertHelper(&local_20e8);
    testing::Message::~Message(&local_20e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20b8);
  cfd::core::DescriptorNode::~DescriptorNode((DescriptorNode *)local_760);
  cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)local_5e8);
  cfd::core::DescriptorScriptReference::~DescriptorScriptReference
            ((DescriptorScriptReference *)
             &pubkey.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string(local_260);
  cfd::core::Script::~Script((Script *)((long)&desc_str.field_2 + 8));
  cfd::core::Descriptor::~Descriptor
            ((Descriptor *)
             &locking_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

TEST(Descriptor, Parse_Taproot_pubkey) {
  //   pubkey: '04ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a116bc35b3f8d748aea5dfad083a73961908797c97fc0ca4f8d874aba9778fc77',
  //   privkey: '5JB4Tt43VA4qbBVRtf88CVKTkJ82pC6mhm9aHywDG27htnFHgqC'
  std::string pubkey_hex = "ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a";
  std::string descriptor1 = "tr(ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a)";
  std::string descriptor2 = "tr(03ef514f1aeb14baa6cc57ab3268fb329ca540c48454f7f46771ed731e34ba521a)";
  Descriptor desc;
  Script locking_script;
  std::string desc_str = "";
  DescriptorScriptReference script_ref;
  SchnorrPubkey pubkey;
  NetType nettype = NetType::kRegtest;
  DescriptorNode node;

  try {
    desc = Descriptor::Parse(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }

  EXPECT_NO_THROW(script_ref = desc.GetReference());
  EXPECT_NO_THROW(node = desc.GetNode());
  EXPECT_TRUE(script_ref.HasKey());
  EXPECT_TRUE(script_ref.HasAddress());
  EXPECT_EQ(1, script_ref.GetKeyNum());
  EXPECT_FALSE(script_ref.HasChild());
  EXPECT_FALSE(script_ref.HasReqNum());
  EXPECT_FALSE(script_ref.HasRedeemScript());
  EXPECT_FALSE(script_ref.HasScriptTree());
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_EQ(AddressType::kTaprootAddress, script_ref.GetAddressType());
  EXPECT_EQ(HashType::kTaproot, script_ref.GetHashType());
  EXPECT_STREQ(script_ref.GenerateAddress(nettype).GetAddress().c_str(),
      "bcrt1pvv8jm84ye0xr7p9h8l2k58rm287nryk73cnw0nvfxyjfqqpn60gssz7u5f");
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "1 630f2d9ea4cbcc3f04b73fd56a1c7b51fd3192de8e26e7cd893124900033d3d1");
  EXPECT_STREQ(pubkey.GetHex().c_str(),
      pubkey_hex.c_str());

  try {
    desc = Descriptor::Parse(descriptor2);
    EXPECT_TRUE(false);
  } catch (const CfdException& except) {
    EXPECT_STREQ("Failed to taproot key. taproot is xonly pubkey only.",
        except.what());
  }

#ifndef CFD_DISABLE_ELEMENTS
  // for elements
  try {
    desc = Descriptor::ParseElements(descriptor1);
  } catch (const CfdException& except) {
    EXPECT_STREQ(except.what(), "");
  }

  EXPECT_NO_THROW(script_ref = desc.GetReference());
  EXPECT_NO_THROW(node = desc.GetNode());
  EXPECT_TRUE(script_ref.HasKey());
  EXPECT_TRUE(script_ref.HasAddress());
  EXPECT_EQ(1, script_ref.GetKeyNum());
  EXPECT_FALSE(script_ref.HasChild());
  EXPECT_FALSE(script_ref.HasReqNum());
  EXPECT_FALSE(script_ref.HasRedeemScript());
  EXPECT_FALSE(script_ref.HasScriptTree());
  EXPECT_NO_THROW(locking_script = desc.GetLockingScript());
  EXPECT_NO_THROW(desc_str = desc.ToString(false));
  EXPECT_EQ(AddressType::kTaprootAddress, script_ref.GetAddressType());
  EXPECT_EQ(HashType::kTaproot, script_ref.GetHashType());
  EXPECT_STREQ(
      script_ref.GenerateAddress(NetType::kElementsRegtest).GetAddress().c_str(),
      "ert1p5l62rfvlte3axg3aeu6p0zwnqr60adqc427jkz70sadzxtjdy7tshjlu6s");
  EXPECT_NO_THROW(pubkey = script_ref.GetKeyList()[0].GetSchnorrPubkey());
  EXPECT_STREQ(desc_str.c_str(), descriptor1.c_str());
  EXPECT_STREQ(locking_script.ToString().c_str(),
      "1 a7f4a1a59f5e63d3223dcf341789d300f4feb418aabd2b0bcf875a232e4d2797");
  EXPECT_STREQ(pubkey.GetHex().c_str(),
      pubkey_hex.c_str());
#endif  // CFD_DISABLE_ELEMENTS
}